

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O3

uint32_t __thiscall
FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  uint32_t b;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint32_t uVar10;
  long lVar11;
  long lVar12;
  uint32_t b_00;
  uint uVar13;
  uint *k;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  
  lVar12 = DAT_001c4548;
  b_00 = *(uint32_t *)(DAT_001c4548 + -4);
  uVar9 = tryB(this,b_00,in,len);
  lVar8 = NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  if (len != 0) {
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = vpbroadcastq_avx512f();
    lVar11 = 0;
    do {
      auVar21 = vpbroadcastq_avx512f();
      auVar22 = vmovdqa64_avx512f(auVar23);
      auVar23 = vporq_avx512f(auVar21,auVar18);
      auVar21 = vporq_avx512f(auVar21,auVar19);
      uVar4 = vpcmpuq_avx512f(auVar21,auVar20,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar23,auVar20,2);
      bVar6 = (byte)uVar4;
      uVar16 = CONCAT11(bVar6,bVar5);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in + lVar11));
      auVar21._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar23._4_4_;
      auVar21._0_4_ = (uint)(bVar5 & 1) * auVar23._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar23._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar23._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar23._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar23._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar23._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar23._28_4_;
      auVar21._32_4_ = (uint)(bVar6 & 1) * auVar23._32_4_;
      auVar21._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar23._36_4_;
      auVar21._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar23._40_4_;
      auVar21._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar23._44_4_;
      auVar21._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar23._48_4_;
      auVar21._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar23._52_4_;
      auVar21._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar23._56_4_;
      auVar21._60_4_ = (uint)(bVar6 >> 7) * auVar23._60_4_;
      lVar11 = lVar11 + 0x10;
      auVar23 = vpord_avx512f(auVar21,auVar22);
    } while ((((ulong)len + 0x3fffffffffffffff & 0x3fffffffffffffff) + 0x10) -
             (ulong)((uint)((ulong)len + 0x3fffffffffffffff) & 0xf) != lVar11);
    auVar18 = vmovdqa32_avx512f(auVar23);
    auVar19._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar22._0_4_;
    bVar1 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar1 * auVar18._4_4_ | (uint)!bVar1 * auVar22._4_4_;
    bVar1 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar1 * auVar18._8_4_ | (uint)!bVar1 * auVar22._8_4_;
    bVar1 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar1 * auVar18._12_4_ | (uint)!bVar1 * auVar22._12_4_;
    bVar1 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar1 * auVar18._16_4_ | (uint)!bVar1 * auVar22._16_4_;
    bVar1 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar1 * auVar18._20_4_ | (uint)!bVar1 * auVar22._20_4_;
    bVar1 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar1 * auVar18._24_4_ | (uint)!bVar1 * auVar22._24_4_;
    bVar1 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar1 * auVar18._28_4_ | (uint)!bVar1 * auVar22._28_4_;
    auVar19._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar22._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar1 * auVar18._36_4_ | (uint)!bVar1 * auVar22._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar1 * auVar18._40_4_ | (uint)!bVar1 * auVar22._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar1 * auVar18._44_4_ | (uint)!bVar1 * auVar22._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar1 * auVar18._48_4_ | (uint)!bVar1 * auVar22._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar1 * auVar18._52_4_ | (uint)!bVar1 * auVar22._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar1 * auVar18._56_4_ | (uint)!bVar1 * auVar22._56_4_;
    auVar19._60_4_ =
         (uint)(bVar6 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpord_avx512f(auVar19,ZEXT3264(auVar17));
    auVar2 = vpor_avx(auVar18._0_16_,auVar18._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpor_avx(auVar2,auVar3);
    if (auVar2._0_4_ != 0) {
      uVar13 = 0x20 - LZCOUNT(auVar2._0_4_);
      goto LAB_001284f4;
    }
  }
  uVar13 = 0;
LAB_001284f4:
  uVar15 = 0;
  do {
    uVar14 = uVar15;
    uVar15 = (ulong)((int)uVar14 + 1);
  } while (*(int *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + uVar14 * 4) + 0x1cU <
           uVar13);
  lVar12 = lVar12 - NewPFor<4u,FastPForLib::Simple16<false>>::possLogs;
  while (uVar7 = uVar15, uVar14 < (lVar12 >> 2) - 1U) {
    b = *(uint32_t *)(lVar8 + uVar14 * 4);
    uVar10 = tryB(this,b,in,len);
    uVar13 = uVar9;
    if (uVar10 < uVar9) {
      uVar13 = uVar10;
    }
    if (uVar10 <= uVar9) {
      b_00 = b;
    }
    uVar9 = uVar13;
    uVar15 = (ulong)((int)uVar7 + 1);
    uVar14 = uVar7;
  }
  return b_00;
}

Assistant:

__attribute__((pure)) uint32_t
OPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  uint32_t b =
      NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs.back();
  assert(b == 32);
  uint32_t bsize = tryB(b, in, len);
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (mb >
         28 + NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (;
       i <
       NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs.size() - 1;
       i++) {
    const uint32_t csize =
        tryB(NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i],
             in, len);

    if (csize <= bsize) {
      b = NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i];
      bsize = csize;
    }
  }
  return b;
}